

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O3

size_t luaC_separateudata(lua_State *L,int all)

{
  global_State *pgVar1;
  Table *events;
  TValue *pTVar2;
  byte bVar3;
  GCObject *pGVar4;
  GCObject *pGVar5;
  size_t sVar6;
  
  pgVar1 = L->l_G;
  pGVar4 = (GCObject *)pgVar1->mainthread;
  pGVar5 = (pGVar4->gch).next;
  if (pGVar5 == (GCObject *)0x0) {
    sVar6 = 0;
  }
  else {
    sVar6 = 0;
    do {
      bVar3 = (pGVar5->gch).marked;
      if (((bVar3 & 8) == 0) && ((bVar3 & 3) != 0 || all != 0)) {
        events = (pGVar5->h).metatable;
        if ((events != (Table *)0x0) && ((events->flags & 4) == 0)) {
          pTVar2 = luaT_gettm(events,TM_GC,L->l_G->tmname[2]);
          bVar3 = (pGVar5->gch).marked;
          if (pTVar2 != (TValue *)0x0) {
            sVar6 = (long)&(pGVar5->h).node[1].i_val.value + sVar6;
            (pGVar5->gch).marked = bVar3 | 8;
            (pGVar4->gch).next = (pGVar5->gch).next;
            if (pgVar1->tmudata == (GCObject *)0x0) {
              (pGVar5->gch).next = pGVar5;
            }
            else {
              (pGVar5->gch).next = (pgVar1->tmudata->gch).next;
              (pgVar1->tmudata->gch).next = pGVar5;
            }
            pgVar1->tmudata = pGVar5;
            pGVar5 = pGVar4;
            goto LAB_00108fbd;
          }
        }
        (pGVar5->gch).marked = bVar3 | 8;
      }
LAB_00108fbd:
      pGVar4 = pGVar5;
      pGVar5 = (pGVar4->gch).next;
    } while (pGVar5 != (GCObject *)0x0);
  }
  return sVar6;
}

Assistant:

static size_t luaC_separateudata(lua_State*L,int all){
global_State*g=G(L);
size_t deadmem=0;
GCObject**p=&g->mainthread->next;
GCObject*curr;
while((curr=*p)!=NULL){
if(!(iswhite(curr)||all)||isfinalized(gco2u(curr)))
p=&curr->gch.next;
else if(fasttm(L,gco2u(curr)->metatable,TM_GC)==NULL){
markfinalized(gco2u(curr));
p=&curr->gch.next;
}
else{
deadmem+=sizeudata(gco2u(curr));
markfinalized(gco2u(curr));
*p=curr->gch.next;
if(g->tmudata==NULL)
g->tmudata=curr->gch.next=curr;
else{
curr->gch.next=g->tmudata->gch.next;
g->tmudata->gch.next=curr;
g->tmudata=curr;
}
}
}
return deadmem;
}